

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

int __thiscall
icu_63::TimeZoneNamesImpl::clone
          (TimeZoneNamesImpl *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  uint in_EAX;
  TimeZoneNamesImpl *this_00;
  UErrorCode status;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  this_00 = (TimeZoneNamesImpl *)UMemory::operator_new((UMemory *)0x140,(size_t)__fn);
  if (this_00 != (TimeZoneNamesImpl *)0x0) {
    TimeZoneNamesImpl(this_00,&this->fLocale,(UErrorCode *)((long)&uStack_18 + 4));
  }
  return (int)this_00;
}

Assistant:

TimeZoneNames*
TimeZoneNamesImpl::clone() const {
    UErrorCode status = U_ZERO_ERROR;
    return new TimeZoneNamesImpl(fLocale, status);
}